

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O3

void __thiscall
http_version_parsing_invalid02_Test::TestBody(http_version_parsing_invalid02_Test *this)

{
  bool bVar1;
  AssertHelper local_30;
  sub_string local_28;
  sub_string local_18;
  
  sub_string::sub_string(&local_28,"","");
  local_18.begin_ = local_28.begin_;
  local_18.end_ = local_28.end_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    parse_request_method(&local_18);
  }
  testing::Message::Message((Message *)&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
             ,0x6d,
             "Expected: parse_request_method(str) throws an exception of type http_parsing_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if ((long *)local_28.begin_ != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_28.begin_ != (long *)0x0)) {
      (**(code **)(*(long *)local_28.begin_ + 8))();
    }
  }
  return;
}

Assistant:

TEST(http_request_method_parsing, invalid02)
{
    sub_string str = sub_string::literal("");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}